

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

void arg_rex_errorfn(arg_rex *parent,arg_dstr_t ds,int errorcode,char *argval,char *progname)

{
  char *shortopts;
  char *longopts;
  char *datatype;
  char *pcVar1;
  
  shortopts = (parent->hdr).shortopts;
  longopts = (parent->hdr).longopts;
  pcVar1 = (parent->hdr).datatype;
  datatype = "";
  if (argval != (char *)0x0) {
    datatype = argval;
  }
  arg_dstr_catf(ds,"%s: ",progname);
  if (errorcode == 7) {
    pcVar1 = "illegal value  ";
  }
  else {
    if (errorcode != 2) {
      if (errorcode != 1) {
        return;
      }
      arg_dstr_cat(ds,"missing option ");
      datatype = pcVar1;
      goto LAB_0010779c;
    }
    pcVar1 = "excess option ";
  }
  arg_dstr_cat(ds,pcVar1);
LAB_0010779c:
  arg_print_option_ds(ds,shortopts,longopts,datatype,"\n");
  return;
}

Assistant:

static void arg_rex_errorfn(struct arg_rex* parent, arg_dstr_t ds, int errorcode, const char* argval, const char* progname) {
    const char* shortopts = parent->hdr.shortopts;
    const char* longopts = parent->hdr.longopts;
    const char* datatype = parent->hdr.datatype;

    /* make argval NULL safe */
    argval = argval ? argval : "";

    arg_dstr_catf(ds, "%s: ", progname);
    switch (errorcode) {
        case ARG_ERR_MINCOUNT:
            arg_dstr_cat(ds, "missing option ");
            arg_print_option_ds(ds, shortopts, longopts, datatype, "\n");
            break;

        case ARG_ERR_MAXCOUNT:
            arg_dstr_cat(ds, "excess option ");
            arg_print_option_ds(ds, shortopts, longopts, argval, "\n");
            break;

        case ARG_ERR_REGNOMATCH:
            arg_dstr_cat(ds, "illegal value  ");
            arg_print_option_ds(ds, shortopts, longopts, argval, "\n");
            break;

        default: {
        #if 0
            char errbuff[256];
            regerror(errorcode, NULL, errbuff, sizeof(errbuff));
            printf("%s\n", errbuff);
        #endif
        } break;
    }
}